

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

void __thiscall
solitaire::events::EventsProcessor::processButtonsHoverState(EventsProcessor *this,MouseMove *event)

{
  byte bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Button *undoButton;
  Button *newGameButton;
  MouseMove *event_local;
  EventsProcessor *this_local;
  long *plVar3;
  
  iVar2 = (*this->context->_vptr_Context[0xc])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  bVar1 = (**(code **)(*plVar3 + 0x18))(plVar3,event);
  (**(code **)(*plVar3 + 0x10))(plVar3,bVar1 & 1);
  iVar2 = (*this->context->_vptr_Context[0xe])();
  plVar3 = (long *)CONCAT44(extraout_var_00,iVar2);
  bVar1 = (**(code **)(*plVar3 + 0x18))(plVar3,event);
  (**(code **)(*plVar3 + 0x10))(plVar3,bVar1 & 1);
  return;
}

Assistant:

void EventsProcessor::processButtonsHoverState(const MouseMove& event) const {
    auto& newGameButton = context.getNewGameButton();
    newGameButton.setHoveredState(
        newGameButton.collidesWith(event.position));
    auto& undoButton = context.getUndoButton();
    undoButton.setHoveredState(
        undoButton.collidesWith(event.position));
}